

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O3

uint64_t kmer_cannonical(uint64_t kmer,uint8_t k)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  uVar4 = CONCAT71(in_register_00000031,k);
  uVar1 = 0;
  uVar3 = (uint)uVar4;
  uVar2 = kmer;
  while (uVar3 != 0) {
    uVar3 = (uint)uVar2;
    uVar2 = uVar2 >> 2;
    uVar1 = (ulong)(uVar3 & 3) + uVar1 * 4 ^ 3;
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
  }
  if (uVar1 < kmer) {
    kmer = uVar1;
  }
  return kmer;
}

Assistant:

uint64_t kmer_cannonical(uint64_t kmer, uint8_t k) {
    uint64_t rkmer=kmer_reverse(kmer,k);
    return (rkmer<kmer ? rkmer:kmer);
}